

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O1

bool PairSearchHelperBool
               (ON_RTreeNode *a_nodeA,ON_RTreeNode *a_nodeB,
               ON_RTreePairSearchCallbackResultBool *a_result)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  ON_RTreeBranch *a_branchA;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *paVar5;
  ON__INT_PTR *pOVar6;
  
  lVar4 = (long)a_nodeA->m_count;
  bVar3 = lVar4 < 1;
  if (0 < lVar4) {
    iVar1 = a_nodeB->m_count;
    a_branchA = a_nodeA->m_branch;
    do {
      paVar5 = &a_nodeB->m_branch[0].field_1;
      if (0 < iVar1) {
        do {
          bVar2 = PairSearchOverlapHelper
                            (&a_branchA->m_rect,(ON_RTreeBBox *)(paVar5 + -6),a_result->m_tolerance)
          ;
          if (bVar2) {
            if (a_nodeA->m_level < 1) {
              if (a_nodeB->m_level < 1) {
                bVar2 = (*a_result->m_resultCallbackBool)
                                  (a_result->m_context,(ON__INT_PTR)(a_branchA->field_1).m_child,
                                   (ON__INT_PTR)paVar5->m_child);
              }
              else {
                bVar2 = PairSearchHelperBool(a_branchA,paVar5->m_child,a_result);
              }
            }
            else if (a_nodeB->m_level < 1) {
              bVar2 = PairSearchHelperBool
                                ((a_branchA->field_1).m_child,(ON_RTreeBranch *)(paVar5 + -6),
                                 a_result);
            }
            else {
              bVar2 = PairSearchHelperBool((a_branchA->field_1).m_child,paVar5->m_child,a_result);
            }
            if (bVar2 == false) {
              return bVar3;
            }
          }
          pOVar6 = (ON__INT_PTR *)(paVar5 + 1);
          paVar5 = paVar5 + 7;
        } while (pOVar6 < a_nodeB->m_branch + iVar1);
      }
      a_branchA = a_branchA + 1;
      bVar2 = a_branchA < a_nodeA->m_branch + lVar4;
      bVar3 = !bVar2;
    } while (bVar2);
  }
  return bVar3;
}

Assistant:

static bool PairSearchHelperBool( const ON_RTreeNode* a_nodeA, const ON_RTreeNode* a_nodeB, ON_RTreePairSearchCallbackResultBool* a_result )
{
  // DO NOT ADD ANYTHING TO THIS FUNCTION
  const ON_RTreeBranch *branchA, *branchAmax, *branchB, *branchBmax;

  branchA = a_nodeA->m_branch;
  branchAmax = branchA + a_nodeA->m_count;
  branchBmax = a_nodeB->m_branch + a_nodeB->m_count;
  while(branchA < branchAmax)
  {
    for ( branchB = a_nodeB->m_branch; branchB < branchBmax; branchB++ )
    {
      if ( PairSearchOverlapHelper( &branchA->m_rect, &branchB->m_rect, a_result->m_tolerance ) )
      {
        if ( a_nodeA->m_level > 0 )
        {
          if ( a_nodeB->m_level > 0 )
          {
            if ( !PairSearchHelperBool(branchA->m_child,branchB->m_child,a_result) )
              return false;
          }
          else
          {
            if ( !PairSearchHelperBool(branchA->m_child,branchB,a_result) )
              return false;
          }
        }
        else if ( a_nodeB->m_level > 0 )
        {
          if ( !PairSearchHelperBool(branchA,branchB->m_child,a_result) )
            return false;
        }
        else
        {
          if ( !a_result->m_resultCallbackBool(a_result->m_context,branchA->m_id,branchB->m_id) )
            return false;
        }
      }
    }
    branchA++;
  }
  return true;
}